

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

void luaL_unref(lua_State *L,int t,int ref)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  lua_State *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (-1 < in_EDX) {
    if ((in_ESI < 1) && (-10000 < in_ESI)) {
      iVar1 = lua_gettop(in_RDI);
      in_ESI = iVar1 + in_ESI + 1;
    }
    iVar1 = in_ESI;
    lua_rawgeti(L,t,ref);
    lua_rawseti((lua_State *)CONCAT44(t,ref),unaff_retaddr_00,unaff_retaddr);
    lua_pushinteger((lua_State *)CONCAT44(iVar1,in_EDX),CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    lua_rawseti((lua_State *)CONCAT44(t,ref),unaff_retaddr_00,unaff_retaddr);
  }
  return;
}

Assistant:

LUALIB_API void luaL_unref(lua_State *L, int t, int ref)
{
  if (ref >= 0) {
    t = abs_index(L, t);
    lua_rawgeti(L, t, FREELIST_REF);
    lua_rawseti(L, t, ref);  /* t[ref] = t[FREELIST_REF] */
    lua_pushinteger(L, ref);
    lua_rawseti(L, t, FREELIST_REF);  /* t[FREELIST_REF] = ref */
  }
}